

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

iterator * __thiscall
ft::map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::insert
          (iterator *__return_storage_ptr__,
          map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          iterator *position,value_type *val)

{
  size_type *psVar1;
  treeNode<ft::pair<const_int,_int>_> *val_00;
  undefined1 z [8];
  undefined1 local_58 [8];
  iterator tmp;
  char local_38;
  
  z = (undefined1  [8])position->m_node;
  if (z == (undefined1  [8])
           (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>)
           .
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           .m_tree.m_last) {
    if ((this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
        super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
        .m_size == 0) {
LAB_00106c37:
      val_00 = (this->
               super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
               super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               .m_tree.m_root;
    }
    else {
      treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
      ::operator--(position);
      val_00 = position->m_node;
      if (val->first <= (val_00->value).first) goto LAB_00106c37;
    }
    BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)local_58,
              (node *)this,&val_00->value);
    z = local_58;
    local_38 = (char)tmp._vptr_treeIterator;
  }
  else {
    if (val->first == (((treeNode<ft::pair<const_int,_int>_> *)z)->value).first) {
      __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113c48;
      __return_storage_ptr__->m_tree = position->m_tree;
      goto LAB_00106cf4;
    }
    if ((this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
        super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
        .m_size == 0) goto LAB_00106c37;
    tmp.m_tree = (RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                  *)z;
    if ((((treeNode<ft::pair<const_int,_int>_> *)z)->value).first < val->first) {
      local_58 = (undefined1  [8])&PTR__treeIterator_00113c48;
      tmp._vptr_treeIterator = (_func_int **)position->m_tree;
      treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
      ::operator++((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                    *)local_58);
      if (((treeNode<ft::pair<const_int,_int>_> *)tmp.m_tree ==
           (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>)
           .
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           .m_tree.m_last) || (val->first < *(int *)&(tmp.m_tree)->NIL)) {
        BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
                  &tmp.m_node,(node *)this,&position->m_node->value);
        z = (undefined1  [8])tmp.m_node;
      }
      else {
        BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
                  &tmp.m_node,(node *)this,
                  &((this->
                    super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                    ).
                    super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                    .m_tree.m_root)->value);
        z = (undefined1  [8])tmp.m_node;
      }
    }
    else {
      local_58 = (undefined1  [8])&PTR__treeIterator_00113c48;
      tmp._vptr_treeIterator = (_func_int **)position->m_tree;
      treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
      ::operator--((treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                    *)local_58);
      if ((position->m_node ==
           ((this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            ).
            super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            .m_tree.m_first)->parent) || (*(int *)&(tmp.m_tree)->NIL < val->first)) {
        BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
                  &tmp.m_node,(node *)this,&position->m_node->value);
        z = (undefined1  [8])tmp.m_node;
      }
      else {
        BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
                  &tmp.m_node,(node *)this,
                  &((this->
                    super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                    ).
                    super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                    .m_tree.m_root)->value);
        z = (undefined1  [8])tmp.m_node;
      }
    }
  }
  if (local_38 != '\0') {
    treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
    ::fixInsertViolation
              ((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                *)this,(node *)z);
    psVar1 = &(this->
              super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
              super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
              .m_size;
    *psVar1 = *psVar1 + 1;
  }
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113c48;
  __return_storage_ptr__->m_tree =
       &(this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
        super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
        .m_tree;
LAB_00106cf4:
  __return_storage_ptr__->m_node = (treeNode<ft::pair<const_int,_int>_> *)z;
  return __return_storage_ptr__;
}

Assistant:

iterator	insert(iterator position, value_type const & val)
	{
		if (position != this->end() && this->equal(position->first, val.first)) return position;

		ft::pair<node*, bool>	ret;

		if (this->empty())
			ret = this->BSTinsert(this->root(), val);
		else if (position == this->end())
		{
			--position;
			if (this->value_comp()(*position, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else if (this->value_comp()(*position, val))
		{
			iterator	tmp(position);
			++tmp;
			if (tmp == this->end() || this->value_comp()(val, *tmp))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else
		{
			iterator	tmp(position);
			--tmp;
			if (position == this->begin() || this->value_comp()(*tmp, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		if (ret.second)
		{
			this->fixInsertViolation(ret.first);
			++this->m_size;
		}
		return iterator(this->m_tree, ret.first);
	}